

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O2

void __thiscall dg::llvmdg::SDG2Dot::dump(SDG2Dot *this,string *file)

{
  _Head_base<0UL,_dg::sdg::DependenceGraph_*,_false> _Var1;
  long lVar2;
  undefined8 *puVar3;
  DGElement *pDVar4;
  ostream *poVar5;
  long *plVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  pointer puVar9;
  undefined8 *puVar10;
  DGElement *nd_00;
  DGParameters *params;
  allocator local_2c9;
  DGNode *nd;
  long *local_2c0;
  long *local_2b8;
  _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
  *local_2b0;
  SDG2Dot *local_2a8;
  DGNodeCall *C;
  pointer local_298;
  DGParameters *local_290;
  pointer local_288;
  set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
  calls;
  string local_250;
  ofstream out;
  
  std::ofstream::ofstream((ostream *)&out,(string *)file,_S_out);
  calls._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &calls._M_t._M_impl.super__Rb_tree_header._M_header;
  calls._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  calls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  calls._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  calls._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       calls._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::operator<<((ostream *)&out,"digraph SDG {\n");
  std::operator<<((ostream *)&out,"  compound=\"true\"\n");
  local_298 = (this->_llvmsdg->_sdg)._graphs.
              super__Vector_base<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>,_std::allocator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2b0 = (_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
               *)&this->dumpedNodes;
  puVar9 = (this->_llvmsdg->_sdg)._graphs.
           super__Vector_base<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>,_std::allocator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2a8 = this;
  while (puVar9 != local_298) {
    _Var1._M_head_impl =
         (puVar9->_M_t).
         super___uniq_ptr_impl<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>
         ._M_t.
         super__Tuple_impl<0UL,_dg::sdg::DependenceGraph_*,_std::default_delete<dg::sdg::DependenceGraph>_>
         .super__Head_base<0UL,_dg::sdg::DependenceGraph_*,_false>._M_head_impl;
    local_288 = puVar9;
    poVar5 = std::operator<<((ostream *)&out,"  subgraph cluster_dg_");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5," {\n");
    std::operator<<((ostream *)&out,"    color=black;\n");
    std::operator<<((ostream *)&out,"    style=filled;\n");
    std::operator<<((ostream *)&out,"    fillcolor=grey95;\n");
    poVar5 = std::operator<<((ostream *)&out,"    label=\"");
    poVar5 = std::operator<<(poVar5,(string *)(_Var1._M_head_impl + 0xa8));
    poVar5 = std::operator<<(poVar5," (id ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,")\";\n");
    std::operator<<((ostream *)&out,"\n");
    std::__cxx11::string::string((string *)&local_250,"formal parameters",(allocator *)&nd);
    local_290 = (DGParameters *)(_Var1._M_head_impl + 0x10);
    dumpParams(this,(ostream *)&out,(DGParameters *)(_Var1._M_head_impl + 0x10),&local_250);
    std::__cxx11::string::_M_dispose();
    local_2c0 = *(long **)(_Var1._M_head_impl + 0x68);
    plVar6 = *(long **)(_Var1._M_head_impl + 0x60);
    while (plVar6 != local_2c0) {
      lVar2 = *plVar6;
      local_2b8 = plVar6;
      poVar5 = std::operator<<((ostream *)&out,"    subgraph cluster_dg_");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"_bb_");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5," {\n");
      poVar5 = std::operator<<((ostream *)&out,"      label=\"bblock #");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"\"\n");
      puVar3 = *(undefined8 **)(lVar2 + 0x140);
      for (puVar10 = *(undefined8 **)(lVar2 + 0x138); puVar10 != puVar3; puVar10 = puVar10 + 1) {
        nd = (DGNode *)*puVar10;
        std::
        _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
        ::_M_insert_unique<dg::sdg::DGNode*const&>(local_2b0,&nd);
        dumpNode(this,(ostream *)&out,nd,(Value *)0x0,(char *)0x0);
        C = (DGNodeCall *)nd;
        if (*(int *)(nd + 0xc) != 6) {
          C = (DGNodeCall *)0x0;
        }
        if (C != (DGNodeCall *)0x0) {
          std::
          _Rb_tree<dg::sdg::DGNodeCall*,dg::sdg::DGNodeCall*,std::_Identity<dg::sdg::DGNodeCall*>,std::less<dg::sdg::DGNodeCall*>,std::allocator<dg::sdg::DGNodeCall*>>
          ::_M_insert_unique<dg::sdg::DGNodeCall*const&>
                    ((_Rb_tree<dg::sdg::DGNodeCall*,dg::sdg::DGNodeCall*,std::_Identity<dg::sdg::DGNodeCall*>,std::less<dg::sdg::DGNodeCall*>,std::allocator<dg::sdg::DGNodeCall*>>
                      *)&calls,&C);
          params = (DGParameters *)(C + 0x170);
          std::__cxx11::string::string((string *)&local_250,"actual parameters",&local_2c9);
          dumpParams(this,(ostream *)&out,params,&local_250);
          std::__cxx11::string::_M_dispose();
        }
      }
      std::operator<<((ostream *)&out,"    }\n");
      plVar6 = local_2b8 + 1;
    }
    std::operator<<((ostream *)&out,"    /* edges */\n");
    puVar3 = *(undefined8 **)(_Var1._M_head_impl + 0x50);
    for (puVar10 = *(undefined8 **)(_Var1._M_head_impl + 0x48); puVar10 != puVar3;
        puVar10 = puVar10 + 1) {
      dumpEdges(this,(ostream *)&out,(DGNode *)*puVar10);
    }
    std::operator<<((ostream *)&out,"    /* block edges */\n");
    local_2c0 = *(long **)(_Var1._M_head_impl + 0x68);
    plVar6 = *(long **)(_Var1._M_head_impl + 0x60);
    while (plVar6 != local_2c0) {
      lVar2 = *plVar6;
      p_Var7 = *(_Rb_tree_node_base **)(lVar2 + 0x120);
      local_2b8 = plVar6;
      while (p_Var7 != (_Rb_tree_node_base *)(lVar2 + 0x110)) {
        pDVar4 = *(DGElement **)(p_Var7 + 1);
        poVar5 = std::operator<<((ostream *)&out,"    ");
        operator<<(poVar5,*(DGElement **)(*(long *)(lVar2 + 0x140) + -8));
        std::operator<<(poVar5," -> ");
        nd_00 = pDVar4;
        if (pDVar4 != (DGElement *)0x0 && *(int *)(pDVar4 + 0xc) == 2) {
          nd_00 = (DGElement *)**(undefined8 **)(pDVar4 + 0x138);
        }
        operator<<((ostream *)&out,nd_00);
        poVar5 = std::operator<<((ostream *)&out,"[color=blue penwidth=2 ");
        poVar5 = std::operator<<(poVar5," ltail=cluster_dg_");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5,"_bb_");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        if (*(int *)(pDVar4 + 0xc) == 2) {
          poVar5 = std::operator<<((ostream *)&out," lhead=cluster_dg_");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5,"_bb_");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        }
        std::operator<<((ostream *)&out,"]\n");
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        this = local_2a8;
      }
      plVar6 = local_2b8 + 1;
    }
    std::operator<<((ostream *)&out,"  }\n");
    dumpParamEdges(this,(ostream *)&out,local_290);
    std::
    _Rb_tree<dg::sdg::DGNode_*,_dg::sdg::DGNode_*,_std::_Identity<dg::sdg::DGNode_*>,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
    ::clear((_Rb_tree<dg::sdg::DGNode_*,_dg::sdg::DGNode_*,_std::_Identity<dg::sdg::DGNode_*>,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
             *)local_2b0);
    puVar9 = local_288 + 1;
  }
  if (calls._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator<<((ostream *)&out," /* call and param edges */\n");
  }
  p_Var8 = calls._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var8 != &calls._M_t._M_impl.super__Rb_tree_header) {
    pDVar4 = *(DGElement **)(p_Var8 + 1);
    bindParamsToCall(this,(ostream *)&out,(DGParameters *)(pDVar4 + 0x170),(DGNode *)pDVar4);
    dumpParamEdges(this,(ostream *)&out,(DGParameters *)(pDVar4 + 0x170));
    for (p_Var7 = *(_Rb_tree_node_base **)(pDVar4 + 0x158);
        p_Var7 != (_Rb_tree_node_base *)(pDVar4 + 0x148);
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      lVar2 = *(long *)(p_Var7 + 1);
      poVar5 = std::operator<<((ostream *)&out,"  ");
      operator<<(poVar5,pDVar4);
      poVar5 = std::operator<<(poVar5," -> ");
      operator<<(poVar5,(DGElement *)**(undefined8 **)(lVar2 + 0x48));
      poVar5 = std::operator<<(poVar5,"[lhead=cluster_dg_");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," label=\"call \'");
      poVar5 = std::operator<<(poVar5,(string *)(lVar2 + 0xa8));
      poVar5 = std::operator<<(poVar5,"\'\"");
      std::operator<<(poVar5," style=dashed penwidth=3]\n");
    }
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    this = local_2a8;
  }
  std::operator<<((ostream *)&out,"}\n");
  std::
  _Rb_tree<dg::sdg::DGNodeCall_*,_dg::sdg::DGNodeCall_*,_std::_Identity<dg::sdg::DGNodeCall_*>,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
  ::~_Rb_tree(&calls._M_t);
  std::ofstream::~ofstream((ostream *)&out);
  return;
}

Assistant:

void dump(const std::string &file) const {
        std::ofstream out(file);
        std::set<sdg::DGNodeCall *> calls;

        out << "digraph SDG {\n";
        out << "  compound=\"true\"\n";

        for (auto *dg : _llvmsdg->getSDG()) {
            ///
            // Dependence graphs (functions)
            out << "  subgraph cluster_dg_" << dg->getID() << " {\n";
            out << "    color=black;\n";
            out << "    style=filled;\n";
            out << "    fillcolor=grey95;\n";
            out << "    label=\"" << dg->getName() << " (id " << dg->getID()
                << ")\";\n";
            out << "\n";

            ///
            // Parameters of the DG
            //
            /// Formal input parameters
            dumpParams(out, dg->getParameters(), "formal parameters");

            ///
            // Basic blocks
            for (auto *blk : dg->getBBlocks()) {
                out << "    subgraph cluster_dg_" << dg->getID() << "_bb_"
                    << blk->getID() << " {\n";
                out << "      label=\"bblock #" << blk->getID() << "\"\n";
                for (auto *nd : blk->getNodes()) {
                    dumpedNodes.insert(nd);
                    dumpNode(out, *nd);

                    if (auto *C = sdg::DGNodeCall::get(nd)) {
                        // store the node for later use (dumping of call edges
                        // etc.)
                        calls.insert(C);
                        // dump actual parameters
                        dumpParams(out, C->getParameters(),
                                   "actual parameters");
                    }
                }
                out << "    }\n";
            }

            ///
            // -- edges --
            out << "    /* edges */\n";
            for (auto *nd : dg->getNodes()) {
                dumpEdges(out, *nd);
            }
            out << "    /* block edges */\n";
            for (auto *blk : dg->getBBlocks()) {
                for (auto *ctrl : blk->controls()) {
                    out << "    " << *blk->back() << " -> ";
                    if (auto *ctrlB = sdg::DGBBlock::get(ctrl)) {
                        out << *ctrlB->front();
                    } else {
                        out << *ctrl;
                    }

                    out << "[color=blue penwidth=2 "
                        << " ltail=cluster_dg_" << dg->getID() << "_bb_"
                        << blk->getID();

                    if (ctrl->getType() == sdg::DGElementType::BBLOCK) {
                        out << " lhead=cluster_dg_" << dg->getID() << "_bb_"
                            << ctrl->getID();
                    }
                    out << "]\n";
                }
            }

            out << "  }\n";

            // formal parameters edges
            dumpParamEdges(out, dg->getParameters());

            dumpedNodes.clear();
        }

        ////
        // -- Interprocedural edges and parameter edges--

        if (!calls.empty()) {
            out << " /* call and param edges */\n";
        }
        for (auto *C : calls) {
            bindParamsToCall(out, C->getParameters(), C);
            dumpParamEdges(out, C->getParameters());
            for (auto *dg : C->getCallees()) {
                out << "  " << *C << " -> " << *dg->getFirstNode()
                    << "[lhead=cluster_dg_" << dg->getID() << " label=\"call '"
                    << dg->getName() << "'\""
                    << " style=dashed penwidth=3]\n";
            }
        }

        out << "}\n";
    }